

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall LinearScan::GeneratorBailIn::~GeneratorBailIn(GeneratorBailIn *this)

{
  SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  JitArenaAllocator *pJVar2;
  SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  Type_conflict pBVar4;
  Type pJVar5;
  Type_conflict pBVar6;
  SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount> *buffer;
  Type_conflict pBVar7;
  
  pSVar1 = this->bailInSymbols;
  pJVar2 = this->func->m_alloc;
  buffer = (SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
            *)(pSVar1->super_SListNodeBase<Memory::ArenaAllocator>).next;
  while (buffer != pSVar1) {
    pSVar3 = (SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
              *)(buffer->super_SListNodeBase<Memory::ArenaAllocator>).next;
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)pJVar2,buffer,
               0x20);
    buffer = pSVar3;
  }
  (pSVar1->super_SListNodeBase<Memory::ArenaAllocator>).next =
       &pSVar1->super_SListNodeBase<Memory::ArenaAllocator>;
  (pSVar1->super_RealCount).count = 0;
  pSVar1 = this->bailInSymbols;
  (pSVar1->super_SListNodeBase<Memory::ArenaAllocator>).next =
       &pSVar1->super_SListNodeBase<Memory::ArenaAllocator>;
  (pSVar1->super_RealCount).count = 0;
  pJVar2 = this->func->m_alloc;
  SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>::
  ~SListBase(pSVar1);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)pJVar2,pSVar1,
             0x10);
  pBVar4 = (this->initializedRegs).head;
  if (pBVar4 != (Type_conflict)0x0) {
    pJVar5 = (this->initializedRegs).alloc;
    pBVar7 = pJVar5->bvFreeList;
    do {
      pBVar6 = pBVar4;
      pBVar4 = pBVar6->next;
      pBVar6->next = pBVar7;
      pBVar7 = pBVar6;
    } while (pBVar4 != (Type)0x0);
    (this->initializedRegs).lastFoundIndex = (Type_conflict)0x0;
    pJVar5->bvFreeList = pBVar6;
    (this->initializedRegs).lastUsedNodePrevNextField = &(this->initializedRegs).head;
  }
  return;
}

Assistant:

LinearScan::GeneratorBailIn::~GeneratorBailIn()
{
    this->bailInSymbols->Clear(this->func->m_alloc);
    this->bailInSymbols->Reset();
    JitAdelete(this->func->m_alloc, this->bailInSymbols);
}